

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_74(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  string *k;
  string *k_00;
  string *k_01;
  undefined1 in_R8B;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDFWriter w;
  anon_class_8_1_6bbe3995 check_split1;
  iterator __end1;
  QPDFNameTreeObjectHelper split3;
  QPDFNameTreeObjectHelper split2;
  QPDFNumberTreeObjectHelper split1;
  iterator local_1c0;
  anon_class_8_1_6bbe3995 local_178;
  iterator local_170;
  long *local_128;
  long local_120;
  long local_118 [2];
  string local_108 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  string local_f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  string local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  QPDFNameTreeObjectHelper local_d8 [56];
  QPDFNameTreeObjectHelper local_a0 [56];
  QPDFNumberTreeObjectHelper local_68 [56];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/Split1",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDF::getTrailer();
  p_Var1 = &local_1c0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_1c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"/Split1","");
  QPDFObjectHandle::getKey(local_e8);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_e8;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(local_68,QVar5,(QPDF *)0x1,(bool)in_R8B);
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1c0._vptr_iterator != p_Var1) {
    operator_delete(local_1c0._vptr_iterator,
                    (ulong)((long)&(local_1c0.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_170.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_170.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFNumberTreeObjectHelper::setSplitThreshold((int)local_68);
  local_178.split1 = local_68;
  test_74::anon_class_8_1_6bbe3995::operator()(&local_178,0xf);
  test_74::anon_class_8_1_6bbe3995::operator()(&local_178,0x23);
  test_74::anon_class_8_1_6bbe3995::operator()(&local_178,0x7d);
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  while( true ) {
    cVar2 = QPDFNumberTreeObjectHelper::iterator::operator==
                      ((iterator *)&local_1c0,(iterator *)&local_170);
    if (cVar2 != '\0') break;
    QPDFNumberTreeObjectHelper::iterator::operator*((iterator *)&local_1c0);
    poVar3 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    QPDFNumberTreeObjectHelper::iterator::operator++((iterator *)&local_1c0);
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&local_170);
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/Split2",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDF::getTrailer();
  local_1c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"/Split2","");
  QPDFObjectHandle::getKey(local_f8);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(local_a0,QVar6,(QPDF *)0x1,(bool)in_R8B);
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1c0._vptr_iterator != p_Var1) {
    operator_delete(local_1c0._vptr_iterator,
                    (ulong)((long)&(local_1c0.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_170.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_170.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFNameTreeObjectHelper::setSplitThreshold((int)local_a0);
  local_1c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"C","");
  test_74::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_a0,(QPDFNameTreeObjectHelper *)&local_1c0,k);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1c0._vptr_iterator != p_Var1) {
    operator_delete(local_1c0._vptr_iterator,
                    (ulong)((long)&(local_1c0.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&local_1c0,&local_170);
    if (cVar2 != '\0') break;
    puVar4 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar4,puVar4[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    QPDFNameTreeObjectHelper::iterator::operator++(&local_1c0);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_170);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/Split3",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDF::getTrailer();
  local_1c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"/Split3","");
  QPDFObjectHandle::getKey(local_108);
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(local_d8,QVar7,(QPDF *)0x1,(bool)in_R8B);
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1c0._vptr_iterator != p_Var1) {
    operator_delete(local_1c0._vptr_iterator,
                    (ulong)((long)&(local_1c0.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_170.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_170.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFNameTreeObjectHelper::setSplitThreshold((int)local_d8);
  local_1c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"P","");
  test_74::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_d8,(QPDFNameTreeObjectHelper *)&local_1c0,k_00);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1c0._vptr_iterator != p_Var1) {
    operator_delete(local_1c0._vptr_iterator,
                    (ulong)((long)&(local_1c0.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_1c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c0,anon_var_dwarf_19fad,anon_var_dwarf_19fad + 2);
  test_74::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_d8,(QPDFNameTreeObjectHelper *)&local_1c0,k_01);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1c0._vptr_iterator != p_Var1) {
    operator_delete(local_1c0._vptr_iterator,
                    (ulong)((long)&(local_1c0.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&local_1c0,&local_170);
    if (cVar2 != '\0') break;
    puVar4 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar4,puVar4[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_128,local_120);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_128 != local_118) {
      operator_delete(local_128,local_118[0] + 1);
    }
    QPDFNameTreeObjectHelper::iterator::operator++(&local_1c0);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_170);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_1c0);
  QPDFWriter::QPDFWriter((QPDFWriter *)&local_1c0,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&local_1c0,0));
  QPDFWriter::setQDFMode(SUB81(&local_1c0,0));
  QPDFWriter::write();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_1c0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1c0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_d8);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_a0);
  QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(local_68);
  return;
}

Assistant:

static void
test_74(QPDF& pdf, char const* arg2)
{
    // This test is crafted to work with split-nntree.pdf
    std::cout << "/Split1" << std::endl;
    auto split1 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Split1"), pdf);
    split1.setSplitThreshold(4);
    auto check_split1 = [&split1](int k) {
        auto i = split1.insert(k, QPDFObjectHandle::newString(QUtil::int_to_string(k)));
        assert(i->first == k);
    };
    check_split1(15);
    check_split1(35);
    check_split1(125);
    for (auto const& i: split1) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Split2" << std::endl;
    auto split2 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Split2"), pdf);
    split2.setSplitThreshold(4);
    auto check_split2 = [](QPDFNameTreeObjectHelper& noh, std::string const& k) {
        auto i = noh.insert(k, QPDFObjectHandle::newUnicodeString(k));
        assert(i->first == k);
    };
    check_split2(split2, "C");
    for (auto const& i: split2) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Split3" << std::endl;
    auto split3 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Split3"), pdf);
    split3.setSplitThreshold(4);
    check_split2(split3, "P");
    check_split2(split3, "\xcf\x80");
    for (auto& i: split3) {
        std::cout << i.first << " " << i.second.unparse() << std::endl;
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}